

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O3

void __thiscall
Memory::SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::
Sweep(SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>
      *this,RecyclerSweep *recyclerSweep)

{
  code *pcVar1;
  bool bVar2;
  anon_class_8_1_b8cf05bd fn;
  undefined4 *puVar3;
  
  fn.recycler = RecyclerSweep::GetRecycler(recyclerSweep);
  bVar2 = RecyclerSweep::InPartialCollect(recyclerSweep);
  if ((!bVar2) &&
     (this->partialHeapBlockList != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,800,"(recyclerSweep.InPartialCollect() || partialHeapBlockList == nullptr)",
                       "recyclerSweep.InPartialCollect() || partialHeapBlockList == nullptr");
    if (!bVar2) goto LAB_00742540;
    *puVar3 = 0;
  }
  bVar2 = RecyclerSweep::InPartialCollect(recyclerSweep);
  if ((!bVar2) &&
     (this->partialSweptHeapBlockList !=
      (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x322,
                       "(recyclerSweep.InPartialCollect() || partialSweptHeapBlockList == nullptr)",
                       "recyclerSweep.InPartialCollect() || partialSweptHeapBlockList == nullptr");
    if (!bVar2) {
LAB_00742540:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  HeapBlockList::
  ForEach<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>,Memory::SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>::SweepVerifyPartialBlocks(Memory::Recycler*,Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>*)::_lambda(Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            (this->partialHeapBlockList,(SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0
             ,fn);
  HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>::
  SweepBucket<Memory::SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>::Sweep(Memory::RecyclerSweep&)::_lambda(Memory::RecyclerSweep&)_1_>
            ((HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>> *)this,
             recyclerSweep);
  return;
}

Assistant:

void
SmallNormalHeapBucketBase<TBlockType>::Sweep(RecyclerSweep& recyclerSweep)
{
#if ENABLE_PARTIAL_GC
#if DBG
    Recycler * recycler = recyclerSweep.GetRecycler();
    // Don't need sweep the partialHeapBlockList, the partially collected heap block list.
    // There should be nothing there that is free-able since the last time we swept

    Assert(recyclerSweep.InPartialCollect() || partialHeapBlockList == nullptr);
#if ENABLE_CONCURRENT_GC
    Assert(recyclerSweep.InPartialCollect() || partialSweptHeapBlockList == nullptr);
#endif
    this->SweepVerifyPartialBlocks(recycler, this->partialHeapBlockList);
#endif
#endif

    BaseT::SweepBucket(recyclerSweep, [](RecyclerSweep& recyclerSweep){});
}